

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_1352d2::SwiftCompilerShellCommand::configureBool
          (SwiftCompilerShellCommand *this,ConfigureContext *ctx,bool *to,StringRef name,
          StringRef value)

{
  undefined1 uVar1;
  int iVar2;
  StringRef name_local;
  Twine local_c8;
  Twine local_b0;
  Twine local_98;
  Twine local_80;
  Twine local_68;
  Twine local_50;
  Twine local_38;
  
  name_local.Length = (size_t)name.Data;
  name_local.Data = to;
  if (value.Length == 5) {
    iVar2 = bcmp(value.Data,"false",5);
    if (iVar2 != 0) goto LAB_0014fd03;
    uVar1 = 0;
  }
  else {
    if ((value.Length != 4) || (*(int *)value.Data != 0x65757274)) {
LAB_0014fd03:
      llvm::Twine::Twine(&local_80,"invalid value: \'",&value);
      llvm::Twine::Twine(&local_98,"\' for attribute \'");
      llvm::Twine::concat(&local_68,&local_80,&local_98);
      llvm::Twine::Twine(&local_b0,&name_local);
      llvm::Twine::concat(&local_50,&local_68,&local_b0);
      llvm::Twine::Twine(&local_c8,"\'");
      llvm::Twine::concat(&local_38,&local_50,&local_c8);
      llbuild::buildsystem::ConfigureContext::error((ConfigureContext *)this,&local_38);
      return false;
    }
    uVar1 = 1;
  }
  *(undefined1 *)&ctx->delegate = uVar1;
  return true;
}

Assistant:

bool configureBool(const ConfigureContext& ctx, bool& to, StringRef name, StringRef value) {
    if (value != "true" && value != "false") {
      ctx.error("invalid value: '" + value + "' for attribute '" +
          name + "'");
      return false;
    }
    to = value == "true";
    return true;
  }